

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# page_heap.cc
# Opt level: O1

void __thiscall tcmalloc::PageHeap::MergeIntoFreeList(PageHeap *this,Span *span)

{
  PageID PVar1;
  Leaf *pLVar2;
  Length LVar3;
  bool bVar4;
  Span *pSVar5;
  ulong uVar6;
  Length LVar7;
  
  PVar1 = span->start;
  LVar7 = span->length;
  if ((this->aggressive_decommit_ == true) &&
     ((*(uint *)&span->field_0x28 & 0x3000000) == 0x1000000)) {
    bVar4 = DecommitSpan(this,span);
    if (bVar4) {
      *(uint *)&span->field_0x28 = *(uint *)&span->field_0x28 & 0xfcffffff | 0x2000000;
    }
  }
  uVar6 = PVar1 - 1;
  if ((uVar6 >> 0x23 == 0) &&
     (pLVar2 = (this->pagemap_).root_[uVar6 >> 0x12], pLVar2 != (Leaf *)0x0)) {
    pSVar5 = (Span *)pLVar2->values[(uint)uVar6 & 0x3ffff];
  }
  else {
    pSVar5 = (Span *)0x0;
  }
  pSVar5 = CheckAndHandlePreMerge(this,span,pSVar5);
  if (pSVar5 != (Span *)0x0) {
    LVar3 = pSVar5->length;
    DeleteSpan(pSVar5);
    uVar6 = span->start - LVar3;
    span->start = uVar6;
    span->length = span->length + LVar3;
    (this->pagemap_).root_[uVar6 >> 0x12]->values[(uint)uVar6 & 0x3ffff] = span;
  }
  uVar6 = LVar7 + PVar1;
  if ((uVar6 < 0x800000000) &&
     (pLVar2 = (this->pagemap_).root_[uVar6 >> 0x12], pLVar2 != (Leaf *)0x0)) {
    pSVar5 = (Span *)pLVar2->values[(uint)uVar6 & 0x3ffff];
  }
  else {
    pSVar5 = (Span *)0x0;
  }
  pSVar5 = CheckAndHandlePreMerge(this,span,pSVar5);
  if (pSVar5 != (Span *)0x0) {
    LVar7 = pSVar5->length;
    DeleteSpan(pSVar5);
    LVar7 = LVar7 + span->length;
    span->length = LVar7;
    uVar6 = (span->start + LVar7) - 1;
    (this->pagemap_).root_[uVar6 >> 0x12]->values[(uint)uVar6 & 0x3ffff] = span;
  }
  PrependToFreeList(this,span);
  return;
}

Assistant:

void PageHeap::MergeIntoFreeList(Span* span) {
  ASSERT(lock_.IsHeld());
  ASSERT(span->location != Span::IN_USE);

  // Coalesce -- we guarantee that "p" != 0, so no bounds checking
  // necessary.  We do not bother resetting the stale pagemap
  // entries for the pieces we are merging together because we only
  // care about the pagemap entries for the boundaries.
  //
  // Note: depending on aggressive_decommit_ mode we allow only
  // similar spans to be coalesced.
  //
  // The following applies if aggressive_decommit_ is enabled:
  //
  // TODO(jar): "Always decommit" causes some extra calls to commit when we are
  // called in GrowHeap() during an allocation :-/.  We need to eval the cost of
  // that oscillation, and possibly do something to reduce it.

  // TODO(jar): We need a better strategy for deciding to commit, or decommit,
  // based on memory usage and free heap sizes.

  const PageID p = span->start;
  const Length n = span->length;

  if (aggressive_decommit_ && span->location == Span::ON_NORMAL_FREELIST) {
    if (DecommitSpan(span)) {
      span->location = Span::ON_RETURNED_FREELIST;
    }
  }

  Span* prev = CheckAndHandlePreMerge(span, GetDescriptor(p-1));
  if (prev != nullptr) {
    // Merge preceding span into this span
    ASSERT(prev->start + prev->length == p);
    const Length len = prev->length;
    DeleteSpan(prev);
    span->start -= len;
    span->length += len;
    pagemap_.set(span->start, span);
  }
  Span* next = CheckAndHandlePreMerge(span, GetDescriptor(p+n));
  if (next != nullptr) {
    // Merge next span into this span
    ASSERT(next->start == p+n);
    const Length len = next->length;
    DeleteSpan(next);
    span->length += len;
    pagemap_.set(span->start + span->length - 1, span);
  }

  PrependToFreeList(span);
}